

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicFixedWingAircraft.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::operator==
          (GED_BasicFixedWingAircraft *this,GED_BasicFixedWingAircraft *Value)

{
  KBOOL KVar1;
  
  if (this->m_ui16EntityID != Value->m_ui16EntityID) {
    return false;
  }
  if ((((((this->m_i16Offsets[0] == Value->m_i16Offsets[0]) &&
         (this->m_i16Offsets[1] == Value->m_i16Offsets[1])) &&
        (this->m_i16Offsets[2] == Value->m_i16Offsets[2])) &&
       ((KVar1 = DATA_TYPE::EntityAppearance::operator!=(&this->m_EA,&Value->m_EA), !KVar1 &&
        (this->m_i8Ori[0] == Value->m_i8Ori[0])))) &&
      ((this->m_i8Ori[1] == Value->m_i8Ori[1] &&
       ((this->m_i8Ori[2] == Value->m_i8Ori[2] && (this->m_ui8FuelStatus == Value->m_ui8FuelStatus))
       )))) && ((this->m_i8HoriDevi == Value->m_i8HoriDevi &&
                (this->m_i8VertDevi == Value->m_i8VertDevi)))) {
    return this->m_i16Spd == Value->m_i16Spd;
  }
  return false;
}

Assistant:

KBOOL GED_BasicFixedWingAircraft::operator == ( const GED_BasicFixedWingAircraft & Value ) const
{
    if( m_ui16EntityID      != Value.m_ui16EntityID )   return false;
    if( m_i16Offsets[0]     != Value.m_i16Offsets[0] )  return false;
    if( m_i16Offsets[1]     != Value.m_i16Offsets[1] )  return false;
    if( m_i16Offsets[2]     != Value.m_i16Offsets[2] )  return false;
    if( m_EA                != Value.m_EA )             return false;
    if( m_i8Ori[0]          != Value.m_i8Ori[0] )       return false;
    if( m_i8Ori[1]          != Value.m_i8Ori[1] )       return false;
    if( m_i8Ori[2]          != Value.m_i8Ori[2] )       return false;
    if( m_ui8FuelStatus     != Value.m_ui8FuelStatus )  return false;
    if( m_i8HoriDevi        != Value.m_i8HoriDevi )     return false;
    if( m_i8VertDevi        != Value.m_i8VertDevi )     return false;
    if(m_i16Spd            != Value.m_i16Spd)         return false;
    return true;
}